

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datamodel.cpp
# Opt level: O3

void __thiscall FSSDataModel::saveSetting(FSSDataModel *this,PSource *source)

{
  int *piVar1;
  DataSourceType DVar2;
  QByteArrayView QVar3;
  QByteArrayView QVar4;
  QByteArrayView QVar5;
  QSettings settings;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined8 local_88;
  anon_union_24_3_e3d07ef4_for_data local_78;
  long *local_50 [2];
  long local_40 [2];
  undefined1 local_30 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  QSettings::QSettings((QSettings *)local_30,(QObject *)0x0);
  local_30._16_8_ = (source->super___shared_ptr<Data::Source,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_18 = (source->super___shared_ptr<Data::Source,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_18->_M_use_count = local_18->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_18->_M_use_count = local_18->_M_use_count + 1;
    }
  }
  DVar2 = getType((PSource *)(local_30 + 0x10));
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
  }
  if (DVar2 == DataSourceTypeDos) {
    QVar4.m_data = (storage_type *)0xb;
    QVar4.m_size = (qsizetype)&local_78;
    QString::fromUtf8(QVar4);
    local_98 = local_78._0_4_;
    uStack_94 = local_78._4_4_;
    uStack_90 = local_78._8_4_;
    uStack_8c = local_78._12_4_;
    local_88 = local_78._16_8_;
    (*((source->super___shared_ptr<Data::Source,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->_vptr_Source
      [1])(local_50);
    QVariant::QVariant((QVariant *)&local_78,(char *)local_50[0]);
    QSettings::setValue((QString *)local_30,(QVariant *)&local_98);
  }
  else if (DVar2 == DataSourceTypeAmiga) {
    QVar3.m_data = (storage_type *)0xd;
    QVar3.m_size = (qsizetype)&local_78;
    QString::fromUtf8(QVar3);
    local_98 = local_78._0_4_;
    uStack_94 = local_78._4_4_;
    uStack_90 = local_78._8_4_;
    uStack_8c = local_78._12_4_;
    local_88 = local_78._16_8_;
    (*((source->super___shared_ptr<Data::Source,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->_vptr_Source
      [1])(local_50);
    QVariant::QVariant((QVariant *)&local_78,(char *)local_50[0]);
    QSettings::setValue((QString *)local_30,(QVariant *)&local_98);
  }
  else {
    QVar5.m_data = (storage_type *)0xe;
    QVar5.m_size = (qsizetype)&local_78;
    QString::fromUtf8(QVar5);
    local_98 = local_78._0_4_;
    uStack_94 = local_78._4_4_;
    uStack_90 = local_78._8_4_;
    uStack_8c = local_78._12_4_;
    local_88 = local_78._16_8_;
    (*((source->super___shared_ptr<Data::Source,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->_vptr_Source
      [1])(local_50);
    QVariant::QVariant((QVariant *)&local_78,(char *)local_50[0]);
    QSettings::setValue((QString *)local_30,(QVariant *)&local_98);
  }
  QVariant::~QVariant((QVariant *)&local_78);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  piVar1 = (int *)CONCAT44(uStack_94,local_98);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(uStack_94,local_98),2,8);
    }
  }
  QSettings::sync();
  QSettings::~QSettings((QSettings *)local_30);
  return;
}

Assistant:

void
FSSDataModel::saveSetting(Data::PSource source) {
  QSettings settings;
  switch (getType(source)) {
    case DataSourceTypeDos:
      settings.setValue("sources/dos", source->get_path().c_str());
      break;
    case DataSourceTypeAmiga:
      settings.setValue("sources/amiga", source->get_path().c_str());
      break;
    case DataSourceTypeCustom:
      settings.setValue("sources/custom", source->get_path().c_str());
      break;
  }
  settings.sync();
}